

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int gotobop(int f,int n)

{
  bool bVar1;
  long lVar2;
  mgwin *pmVar3;
  line *plVar4;
  bool bVar5;
  line *plVar6;
  ushort **ppuVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  int iVar9;
  line *plVar10;
  int local_54;
  ulong uStack_50;
  int i;
  ulong local_48;
  line *local_40;
  char local_31;
  
  pmVar3 = curwp;
  local_48 = CONCAT44(in_register_00000034,n);
  if (n < 0) {
    iVar9 = do_gotoeop(f,-n,&local_54);
  }
  else {
    if (n != 0) {
      local_40 = curbp->b_headp;
      plVar10 = curwp->w_dotp;
      do {
        if (plVar10->l_bp != local_40) {
          iVar9 = pmVar3->w_dotline;
          bVar1 = false;
          plVar4 = plVar10->l_bp;
          do {
            plVar6 = plVar4;
            pmVar3->w_doto = 0;
            uStack_50 = (ulong)plVar10->l_used;
            local_31 = 0 < (long)uStack_50;
            if ((long)uStack_50 < 1) {
LAB_00114a4b:
              bVar5 = false;
              if (bVar1) break;
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar7 + (ulong)(byte)*plVar10->l_text * 2 + 1) & 0x20) != 0) {
                uVar8 = 0;
                do {
                  if (uStack_50 - 1 == uVar8) goto LAB_00114a4b;
                  lVar2 = uVar8 + 1;
                  uVar8 = uVar8 + 1;
                } while ((*(byte *)((long)*ppuVar7 + (ulong)(byte)plVar10->l_text[lVar2] * 2 + 1) &
                         0x20) != 0);
                local_31 = uVar8 < uStack_50;
              }
              bVar5 = true;
              if (local_31 == '\0') goto LAB_00114a4b;
            }
            bVar1 = bVar5;
            iVar9 = iVar9 + -1;
            pmVar3->w_dotline = iVar9;
            pmVar3->w_dotp = plVar6;
            plVar4 = plVar6->l_bp;
            plVar10 = plVar6;
          } while (plVar6->l_bp != local_40);
        }
        iVar9 = (int)local_48;
        local_48 = (ulong)(iVar9 - 1);
      } while (1 < iVar9);
    }
    curwp->w_rflag = curwp->w_rflag | 2;
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int
gotobop(int f, int n)
{
	int col, nospace;

	/* the other way... */
	if (n < 0)
		return (gotoeop(f, -n));

	while (n-- > 0) {
		nospace = 0;
		while (lback(curwp->w_dotp) != curbp->b_headp) {
			curwp->w_doto = 0;
			col = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotline--;
			curwp->w_dotp = lback(curwp->w_dotp);
		}
	}
	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}